

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_create(uchar **out,size_t *outlength,uint length,char *type,uchar *data)

{
  ulong new_size;
  uchar *puVar1;
  size_t new_length;
  uchar *new_buffer;
  uchar *chunk;
  uint i;
  uchar *data_local;
  char *type_local;
  uint length_local;
  size_t *outlength_local;
  uchar **out_local;
  
  new_size = *outlength + (ulong)length + 0xc;
  if ((new_size < length + 0xc) || (new_size < *outlength)) {
    out_local._4_4_ = 0x4d;
  }
  else {
    puVar1 = (uchar *)lodepng_realloc(*out,new_size);
    if (puVar1 == (uchar *)0x0) {
      out_local._4_4_ = 0x53;
    }
    else {
      *out = puVar1;
      *outlength = new_size;
      puVar1 = *out + (*outlength - (ulong)length) + -0xc;
      lodepng_set32bitInt(puVar1,length);
      puVar1[4] = *type;
      puVar1[5] = type[1];
      puVar1[6] = type[2];
      puVar1[7] = type[3];
      for (chunk._4_4_ = 0; chunk._4_4_ != length; chunk._4_4_ = chunk._4_4_ + 1) {
        puVar1[chunk._4_4_ + 8] = data[chunk._4_4_];
      }
      lodepng_chunk_generate_crc(puVar1);
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

unsigned lodepng_chunk_create(unsigned char** out, size_t* outlength, unsigned length,
                              const char* type, const unsigned char* data)
{
  unsigned i;
  unsigned char *chunk, *new_buffer;
  size_t new_length = (*outlength) + length + 12;
  if(new_length < length + 12 || new_length < (*outlength)) return 77; /*integer overflow happened*/
  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outlength) = new_length;
  chunk = &(*out)[(*outlength) - length - 12];

  /*1: length*/
  lodepng_set32bitInt(chunk, (unsigned)length);

  /*2: chunk name (4 letters)*/
  chunk[4] = (unsigned char)type[0];
  chunk[5] = (unsigned char)type[1];
  chunk[6] = (unsigned char)type[2];
  chunk[7] = (unsigned char)type[3];

  /*3: the data*/
  for(i = 0; i != length; ++i) chunk[8 + i] = data[i];

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}